

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::HasRepeatedFields(Descriptor *descriptor)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  Descriptor *descriptor_00;
  bool bVar7;
  
  uVar3 = (ulong)*(int *)(descriptor + 0x68);
  bVar7 = 0 < (long)uVar3;
  if (0 < (long)uVar3) {
    if (*(int *)(*(long *)(descriptor + 0x28) + 0x3c) != 3) {
      piVar4 = (int *)(*(long *)(descriptor + 0x28) + 0xd4);
      uVar6 = 0;
      do {
        if (uVar3 - 1 == uVar6) goto LAB_0022fd73;
        uVar6 = uVar6 + 1;
        iVar1 = *piVar4;
        piVar4 = piVar4 + 0x26;
      } while (iVar1 != 3);
      bVar7 = uVar6 < uVar3;
    }
    if (bVar7) {
      return true;
    }
  }
LAB_0022fd73:
  uVar3 = (ulong)*(int *)(descriptor + 0x70);
  bVar7 = 0 < (long)uVar3;
  if (0 < (long)uVar3) {
    descriptor_00 = *(Descriptor **)(descriptor + 0x38);
    bVar2 = HasRepeatedFields(descriptor_00);
    if (!bVar2) {
      uVar6 = 1;
      do {
        uVar5 = uVar6;
        descriptor_00 = descriptor_00 + 0x90;
        if (uVar3 == uVar5) break;
        bVar7 = HasRepeatedFields(descriptor_00);
        uVar6 = uVar5 + 1;
      } while (!bVar7);
      bVar7 = uVar5 < uVar3;
    }
  }
  return bVar7;
}

Assistant:

static bool HasRepeatedFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    if (descriptor->field(i)->label() == FieldDescriptor::LABEL_REPEATED) {
      return true;
    }
  }
  for (int i = 0; i < descriptor->nested_type_count(); ++i) {
    if (HasRepeatedFields(descriptor->nested_type(i))) return true;
  }
  return false;
}